

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PPointer::SetOps(PPointer *this)

{
  PType *pPVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  byte bVar5;
  bool bVar6;
  PClass *pPVar4;
  
  (this->super_PBasicType).super_PType.storeOp = '1';
  pPVar2 = PClass::RegistrationInfo.MyClass;
  pPVar1 = this->PointedType;
  if (pPVar1 == (PType *)0x0) {
    bVar5 = 0x1e;
  }
  else {
    pPVar4 = (pPVar1->super_PTypeBase).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (pPVar1->super_PTypeBase).super_DObject.Class = pPVar4;
    }
    bVar6 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar6) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    bVar5 = (bVar6 ^ 1U) * '\x02' | 0x1c;
  }
  (this->super_PBasicType).super_PType.loadOp = bVar5;
  (this->super_PBasicType).super_PType.moveOp = ';';
  (this->super_PBasicType).super_PType.RegType = '\x03';
  return;
}

Assistant:

void PPointer::SetOps()
{
	storeOp = OP_SP;
	loadOp = (PointedType && PointedType->IsKindOf(RUNTIME_CLASS(PClass))) ? OP_LO : OP_LP;
	moveOp = OP_MOVEA;
	RegType = REGT_POINTER;
}